

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal-utils.h
# Opt level: O2

Expression * wasm::LiteralUtils::makeZero(Type type,Module *wasm)

{
  bool bVar1;
  Const *value;
  Unary *pUVar2;
  SmallVector<wasm::Literal,_1UL> local_58;
  Builder local_20;
  Builder builder;
  
  bVar1 = canMakeZero(type);
  if (bVar1) {
    local_20.wasm = wasm;
    if (type.id == 6) {
      value = Builder::makeConst<int>(&local_20,0);
      pUVar2 = Builder::makeUnary(&local_20,SplatVecI32x4,(Expression *)value);
    }
    else {
      Literal::makeZeros((Literals *)&local_58,type);
      pUVar2 = (Unary *)Builder::makeConstantExpression(&local_20,(Literals *)&local_58);
      SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_58);
    }
    return (Expression *)pUVar2;
  }
  __assert_fail("canMakeZero(type)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/literal-utils.h"
                ,0x23,"Expression *wasm::LiteralUtils::makeZero(Type, Module &)");
}

Assistant:

inline Expression* makeZero(Type type, Module& wasm) {
  assert(canMakeZero(type));
  // TODO: Remove this function once V8 supports v128.const
  // (https://bugs.chromium.org/p/v8/issues/detail?id=8460)
  Builder builder(wasm);
  if (type == Type::v128) {
    return builder.makeUnary(SplatVecI32x4, builder.makeConst(int32_t(0)));
  }
  return builder.makeConstantExpression(Literal::makeZeros(type));
}